

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  ScoreList *this;
  Score *pSVar2;
  Score *score;
  Score *score_00;
  Score *score_01;
  ScoreIterator *pSVar3;
  undefined4 extraout_var;
  ostream *this_00;
  long *plVar5;
  long *local_58;
  long local_50;
  long local_48 [2];
  Score *local_38;
  long lVar4;
  
  this = (ScoreList *)operator_new(0x110);
  ScoreList::ScoreList(this);
  pSVar2 = (Score *)operator_new(0x30);
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"s1","");
  pSVar2->_vptr_Score = (_func_int **)&PTR__Score_00104d10;
  (pSVar2->_name)._M_dataplus._M_p = (pointer)&(pSVar2->_name).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pSVar2->_name,local_58,local_50 + (long)local_58);
  pSVar2->_score = 10;
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  score = (Score *)operator_new(0x30);
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"s2","");
  score->_vptr_Score = (_func_int **)&PTR__Score_00104d10;
  (score->_name)._M_dataplus._M_p = (pointer)&(score->_name).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&score->_name,local_58,local_50 + (long)local_58);
  score->_score = 0xf;
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  score_00 = (Score *)operator_new(0x30);
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"s3","");
  score_00->_vptr_Score = (_func_int **)&PTR__Score_00104d10;
  (score_00->_name)._M_dataplus._M_p = (pointer)&(score_00->_name).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&score_00->_name,local_58,local_50 + (long)local_58);
  score_00->_score = 9;
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  score_01 = (Score *)operator_new(0x30);
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"s4","");
  score_01->_vptr_Score = (_func_int **)&PTR__Score_00104d10;
  (score_01->_name)._M_dataplus._M_p = (pointer)&(score_01->_name).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&score_01->_name,local_58,local_50 + (long)local_58);
  score_01->_score = 0;
  local_38 = pSVar2;
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  pSVar2 = (Score *)operator_new(0x30);
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"s5","");
  pSVar2->_vptr_Score = (_func_int **)&PTR__Score_00104d10;
  (pSVar2->_name)._M_dataplus._M_p = (pointer)&(pSVar2->_name).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pSVar2->_name,local_58,(long)local_58 + local_50);
  pSVar2->_score = 0x13;
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  ScoreList::append(this,local_38);
  ScoreList::append(this,score);
  ScoreList::append(this,score_00);
  ScoreList::append(this,score_01);
  ScoreList::append(this,pSVar2);
  pSVar3 = ScoreList::iterator(this);
  (*(pSVar3->super_Iterator)._vptr_Iterator[2])(pSVar3);
  do {
    iVar1 = (*(pSVar3->super_Iterator)._vptr_Iterator[5])(pSVar3);
    lVar4 = CONCAT44(extraout_var,iVar1);
    if (lVar4 != 0) {
      local_58 = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,*(long *)(lVar4 + 8),
                 *(long *)(lVar4 + 0x10) + *(long *)(lVar4 + 8));
      this_00 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)local_58,local_50);
      std::__ostream_insert<char,std::char_traits<char>>(this_00,":",1);
      plVar5 = (long *)std::ostream::operator<<(this_00,*(int *)(lVar4 + 0x28));
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
      if (local_58 != local_48) {
        operator_delete(local_58,local_48[0] + 1);
      }
    }
    iVar1 = (*(pSVar3->super_Iterator)._vptr_Iterator[4])(pSVar3);
  } while ((char)iVar1 != '\0');
  if (0 < this->_count) {
    iVar1 = 0;
    do {
      pSVar2 = ScoreList::get(this,iVar1);
      if (pSVar2 != (Score *)0x0) {
        pSVar2 = ScoreList::get(this,iVar1);
        if (pSVar2 != (Score *)0x0) {
          (*pSVar2->_vptr_Score[1])(pSVar2);
        }
      }
      iVar1 = iVar1 + 1;
    } while (iVar1 < this->_count);
  }
  (*this->_vptr_ScoreList[1])(this);
  (*(pSVar3->super_Iterator)._vptr_Iterator[1])(pSVar3);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	ScoreList* list = new ScoreList();

	Score* s1 = new Score("s1", 10);
	Score* s2 = new Score("s2", 15);
	Score* s3 = new Score("s3", 9);
	Score* s4 = new Score("s4", 0);
	Score* s5 = new Score("s5", 19);

	list->append(s1);
	list->append(s2);
	list->append(s3);
	list->append(s4);
	list->append(s5);

	ScoreIterator* it= list->iterator();

	it->first();
	do {
		Score* s = it->current();
		if (!s)
			continue;

		cout<<s->getName()<<":"<<s->getScore()<<endl;

	} while (it->next());

	for (int i = 0; i < list->count(); ++i) {
		if (list->get(i))
			delete list->get(i);
	}
	delete list;
	delete it;

	return 0;
}